

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O1

status_t tchecker::refdbm::constrain
                   (db_t *rdbm,reference_clock_variables_t *r,clock_id_t x,clock_id_t y,
                   ineq_cmp_t cmp,integer_t value)

{
  ulong uVar1;
  bool bVar2;
  status_t sVar3;
  
  if (rdbm == (db_t *)0x0) {
    __assert_fail("rdbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,500,
                  "enum tchecker::dbm::status_t tchecker::refdbm::constrain(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
                 );
  }
  bVar2 = is_tight(rdbm,r);
  if (!bVar2) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x1f5,
                  "enum tchecker::dbm::status_t tchecker::refdbm::constrain(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
                 );
  }
  uVar1 = *(stored_size_type *)
           ((long)&(r->super_flat_clock_variables_t).
                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._key_map.m_flat_tree.m_data + 8);
  if (uVar1 != *(stored_size_type *)
                ((long)&(r->super_flat_clock_variables_t).
                        super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._index._value_map.m_flat_tree.m_data + 8)) {
    __assert_fail("_key_map.size() == _value_map.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                  ,0x90,
                  "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
                 );
  }
  if (x < uVar1) {
    if (y < uVar1) {
      sVar3 = tchecker::dbm::constrain(rdbm,(clock_id_t)uVar1,x,y,cmp,value);
      return sVar3;
    }
    __assert_fail("y < r.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x1f7,
                  "enum tchecker::dbm::status_t tchecker::refdbm::constrain(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
                 );
  }
  __assert_fail("x < r.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                ,0x1f6,
                "enum tchecker::dbm::status_t tchecker::refdbm::constrain(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
               );
}

Assistant:

enum tchecker::dbm::status_t constrain(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r,
                                       tchecker::clock_id_t x, tchecker::clock_id_t y, tchecker::ineq_cmp_t cmp,
                                       tchecker::integer_t value)
{
  assert(rdbm != nullptr);
  assert(tchecker::refdbm::is_tight(rdbm, r));
  assert(x < r.size());
  assert(y < r.size());
  return tchecker::dbm::constrain(rdbm, r.size(), x, y, cmp, value);
}